

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<asd::Header<asd::version<1UL>_>_> * __thiscall
pybind11::class_<asd::Header<asd::version<1ul>>>::
def_readwrite<asd::Header<asd::version<1ul>>,float,char[47]>
          (class_<asd::Header<asd::version<1ul>>> *this,char *name,
          offset_in_Header<asd::version<0UL>_>_to_int pm,char (*extra) [47])

{
  cpp_function fset;
  cpp_function fget;
  is_method local_48;
  cpp_function local_40;
  is_method local_38;
  is_method local_30;
  
  local_48.class_.m_ptr = *(handle *)this;
  local_38.class_.m_ptr = (handle)(handle)pm;
  cpp_function::
  cpp_function<pybind11::class_<asd::Header<asd::version<1ul>>>::def_readwrite<asd::Header<asd::version<1ul>>,float,char[47]>(char_const*,float_asd::Header<asd::version<1ul>>::*,char_const(&)[47])::_lambda(asd::Header<asd::version<1ul>>const&)_1_,pybind11::is_method,void>
            (&local_40,(type *)&local_38,&local_48);
  local_30.class_.m_ptr = *(handle *)this;
  local_38.class_.m_ptr = (handle)(handle)pm;
  cpp_function::
  cpp_function<pybind11::class_<asd::Header<asd::version<1ul>>>::def_readwrite<asd::Header<asd::version<1ul>>,float,char[47]>(char_const*,float_asd::Header<asd::version<1ul>>::*,char_const(&)[47])::_lambda(asd::Header<asd::version<1ul>>&,float_const&)_1_,pybind11::is_method,void>
            ((cpp_function *)&local_48,(type *)&local_38,&local_30);
  local_30.class_.m_ptr._0_1_ = 6;
  local_38.class_.m_ptr = *(handle *)this;
  def_property_static<pybind11::is_method,pybind11::return_value_policy,char[47]>
            (this,name,&local_40,(cpp_function *)&local_48,&local_38,
             (return_value_policy *)&local_30,extra);
  object::~object((object *)&local_48);
  object::~object((object *)&local_40);
  return (class_<asd::Header<asd::version<1UL>_>_> *)this;
}

Assistant:

class_ &def_readwrite(const char *name, D C::*pm, const Extra &...extra) {
        static_assert(std::is_same<C, type>::value || std::is_base_of<C, type>::value,
                      "def_readwrite() requires a class member (or base class member)");
        cpp_function fget([pm](const type &c) -> const D & { return c.*pm; }, is_method(*this)),
            fset([pm](type &c, const D &value) { c.*pm = value; }, is_method(*this));
        def_property(name, fget, fset, return_value_policy::reference_internal, extra...);
        return *this;
    }